

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>>>
::find_or_prepare_insert_non_soo<google::protobuf::compiler::SCC_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>>>
          *this,SCC **key)

{
  ctrl_t *pcVar1;
  SCC *pSVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  char cVar7;
  long lVar8;
  slot_type *psVar9;
  ctrl_t *pcVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  ushort uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  __m128i match;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  FindInfo FVar25;
  ctrl_t cVar20;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  
  pcVar10 = *(ctrl_t **)(this + 0x10);
  pSVar2 = *key;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pSVar2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)&(pSVar2->descriptors).
                        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                 (SUB168(auVar18 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar18 * ZEXT816(0x9ddfea08eb382d69),8));
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar17 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar13 = uVar17 >> 7 ^ (ulong)pcVar10 >> 0xc;
  auVar18 = ZEXT216(CONCAT11((char)uVar17,(char)uVar17) & 0x7f7f);
  auVar18 = pshuflw(auVar18,auVar18,0);
  uVar16 = 0;
  do {
    uVar13 = uVar13 & uVar3;
    pcVar1 = pcVar10 + uVar13;
    cVar20 = auVar18[0];
    auVar21[0] = -(cVar20 == *pcVar1);
    cVar22 = auVar18[1];
    auVar21[1] = -(cVar22 == pcVar1[1]);
    cVar23 = auVar18[2];
    auVar21[2] = -(cVar23 == pcVar1[2]);
    cVar24 = auVar18[3];
    auVar21[3] = -(cVar24 == pcVar1[3]);
    auVar21[4] = -(cVar20 == pcVar1[4]);
    auVar21[5] = -(cVar22 == pcVar1[5]);
    auVar21[6] = -(cVar23 == pcVar1[6]);
    auVar21[7] = -(cVar24 == pcVar1[7]);
    auVar21[8] = -(cVar20 == pcVar1[8]);
    auVar21[9] = -(cVar22 == pcVar1[9]);
    auVar21[10] = -(cVar23 == pcVar1[10]);
    auVar21[0xb] = -(cVar24 == pcVar1[0xb]);
    auVar21[0xc] = -(cVar20 == pcVar1[0xc]);
    auVar21[0xd] = -(cVar22 == pcVar1[0xd]);
    auVar21[0xe] = -(cVar23 == pcVar1[0xe]);
    auVar21[0xf] = -(cVar24 == pcVar1[0xf]);
    uVar14 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf;
    uVar12 = (uint)uVar14;
    while (uVar14 != 0) {
      uVar4 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar15 = uVar4 + uVar13 & uVar3;
      if (*(SCC **)(*(long *)(this + 0x18) + uVar15 * 0x28) == pSVar2) {
        if (pcVar10 == (ctrl_t *)0x0) goto LAB_001ecc97;
        psVar9 = (slot_type *)(*(long *)(this + 0x18) + uVar15 * 0x28);
        pcVar10 = pcVar10 + uVar15;
        bVar11 = false;
        goto LAB_001ecc5c;
      }
      uVar14 = (ushort)(uVar12 - 1) & (ushort)uVar12;
      uVar12 = CONCAT22((short)(uVar12 - 1 >> 0x10),uVar14);
    }
    auVar19[0] = -(*pcVar1 == kEmpty);
    auVar19[1] = -(pcVar1[1] == kEmpty);
    auVar19[2] = -(pcVar1[2] == kEmpty);
    auVar19[3] = -(pcVar1[3] == kEmpty);
    auVar19[4] = -(pcVar1[4] == kEmpty);
    auVar19[5] = -(pcVar1[5] == kEmpty);
    auVar19[6] = -(pcVar1[6] == kEmpty);
    auVar19[7] = -(pcVar1[7] == kEmpty);
    auVar19[8] = -(pcVar1[8] == kEmpty);
    auVar19[9] = -(pcVar1[9] == kEmpty);
    auVar19[10] = -(pcVar1[10] == kEmpty);
    auVar19[0xb] = -(pcVar1[0xb] == kEmpty);
    auVar19[0xc] = -(pcVar1[0xc] == kEmpty);
    auVar19[0xd] = -(pcVar1[0xd] == kEmpty);
    auVar19[0xe] = -(pcVar1[0xe] == kEmpty);
    auVar19[0xf] = -(pcVar1[0xf] == kEmpty);
    uVar14 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    if (uVar14 != 0) {
      cVar7 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (uVar3,uVar17,pcVar10);
      if (cVar7 == '\0') {
        uVar12 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
      }
      else {
        uVar5 = 0xf;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar12 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
      }
      FVar25.offset = uVar12 + uVar13 & uVar3;
      FVar25.probe_length = uVar16;
      lVar8 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                        ((CommonFields *)this,uVar17,FVar25,
                         (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
LAB_001ecc97:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::compiler::SCC *, absl::flat_hash_set<const google::protobuf::compiler::SCC *>>, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, std::allocator<std::pair<const google::protobuf::compiler::SCC *const, absl::flat_hash_set<const google::protobuf::compiler::SCC *>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::compiler::SCC *, absl::flat_hash_set<const google::protobuf::compiler::SCC *>>, Hash = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::compiler::SCC *const, absl::flat_hash_set<const google::protobuf::compiler::SCC *>>>]"
                     );
      }
      pcVar10 = (ctrl_t *)(*(long *)(this + 0x10) + lVar8);
      psVar9 = (slot_type *)(lVar8 * 0x28 + *(long *)(this + 0x18));
      bVar11 = true;
LAB_001ecc5c:
      (__return_storage_ptr__->first).ctrl_ = pcVar10;
      (__return_storage_ptr__->first).field_1.slot_ = psVar9;
      __return_storage_ptr__->second = bVar11;
      return __return_storage_ptr__;
    }
    uVar13 = uVar13 + uVar16 + 0x10;
    uVar16 = uVar16 + 0x10;
    if (uVar3 < uVar16) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::compiler::SCC *, absl::flat_hash_set<const google::protobuf::compiler::SCC *>>, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, std::allocator<std::pair<const google::protobuf::compiler::SCC *const, absl::flat_hash_set<const google::protobuf::compiler::SCC *>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::compiler::SCC *, absl::flat_hash_set<const google::protobuf::compiler::SCC *>>, Hash = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::compiler::SCC *const, absl::flat_hash_set<const google::protobuf::compiler::SCC *>>>, K = const google::protobuf::compiler::SCC *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }